

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

void __thiscall
cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::add_tag
          (rules_holder<cppcms::xss::icompare_c_string,_false> *this,string *name,tag_type type)

{
  mapped_type *pmVar1;
  tag_type in_EDX;
  string *in_stack_ffffffffffffffa8;
  c_string *in_stack_ffffffffffffffb0;
  key_type *in_stack_ffffffffffffffc8;
  map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>_>
  *in_stack_ffffffffffffffd0;
  
  details::c_string::c_string(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pmVar1 = std::
           map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>_>
           ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pmVar1->type = in_EDX;
  details::c_string::~c_string((c_string *)0x464e68);
  return;
}

Assistant:

void add_tag(std::string const &name,rules::tag_type type)
		{
			tags[c_string(name)].type=type;
		}